

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistatstest.cpp
# Opt level: O2

void test_stringparser_updatewidthnumber(void)

{
  ostream *poVar1;
  runtime_error *prVar2;
  long width;
  string local_1c0 [32];
  stringstream msg;
  ostream local_190 [376];
  
  width = 0;
  StringParser::updateWidthNumber<short>(1,&width);
  if (width != 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    poVar1 = std::operator<<(local_190,"StringParser::updateWidthNumber failed on updating short");
    std::endl<char,std::char_traits<char>>(poVar1);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,local_1c0);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  StringParser::updateWidthNumber<int>(1,&width);
  if (width != 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    poVar1 = std::operator<<(local_190,"StringParser::updateWidthNumber failed on updating int");
    std::endl<char,std::char_traits<char>>(poVar1);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,local_1c0);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  StringParser::updateWidthNumber<long>(1,&width);
  if (width != 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    poVar1 = std::operator<<(local_190,"StringParser::updateWidthNumber failed on updating long");
    std::endl<char,std::char_traits<char>>(poVar1);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,local_1c0);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  StringParser::updateWidthNumber<long_long>(1,&width);
  if (width == 1) {
    StringParser::updateWidthNumber<float>(1.0,&width);
    if (width != 8) {
      std::__cxx11::stringstream::stringstream((stringstream *)&msg);
      poVar1 = std::operator<<(local_190,"StringParser::updateWidthNumber failed on updating float")
      ;
      std::endl<char,std::char_traits<char>>(poVar1);
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar2,local_1c0);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    StringParser::updateWidthNumber<double>(1.0,&width);
    if (width == 8) {
      return;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    poVar1 = std::operator<<(local_190,"StringParser::updateWidthNumber failed on updating double");
    std::endl<char,std::char_traits<char>>(poVar1);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,local_1c0);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&msg);
  poVar1 = std::operator<<(local_190,"StringParser::updateWidthNumber failed on updating long long")
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar2,local_1c0);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_stringparser_updatewidthnumber()
{

    long width = 0;
    StringParser::updateWidthNumber<short>(1, width);
    ASSERT_EQUAL(width, 1, "StringParser::updateWidthNumber failed on updating short");
    StringParser::updateWidthNumber<int>(1, width);
    ASSERT_EQUAL(width, 1, "StringParser::updateWidthNumber failed on updating int");
    StringParser::updateWidthNumber<long>(1, width);
    ASSERT_EQUAL(width, 1, "StringParser::updateWidthNumber failed on updating long");
    StringParser::updateWidthNumber<long long>(1, width);
    ASSERT_EQUAL(width, 1, "StringParser::updateWidthNumber failed on updating long long");
    StringParser::updateWidthNumber<float>(1, width);
    ASSERT_EQUAL(width, 8, "StringParser::updateWidthNumber failed on updating float");
    StringParser::updateWidthNumber<double>(1, width);
    ASSERT_EQUAL(width, 8, "StringParser::updateWidthNumber failed on updating double");

}